

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gp3p_main
               (Matrix3d *f,Matrix3d *v,Matrix3d *p,transformations_t *solutions)

{
  Scalar *pSVar1;
  long *scalar;
  Index IVar2;
  Scalar *pSVar3;
  Scalar *pSVar4;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
  *pMVar5;
  double dVar6;
  double dVar7;
  double *pdVar8;
  transformation_t transformation;
  translation_t translation;
  point_t temp;
  size_t i_1;
  point_t center_world;
  point_t center_cam;
  rotation_t rotation;
  complex<double> depth;
  complex<double> cay;
  size_t i;
  Vector3d n;
  cayley_t cayley;
  complex<double> eigValue;
  int c;
  Matrix<std::complex<double>,_8,_8,_0,_8,_8> V;
  Matrix<std::complex<double>,_8,_1,_0,_8,_1> D;
  EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> Eig;
  Matrix<double,_8,_8,_0,_8,_8> M;
  Matrix<double,_48,_85,_0,_48,_85> groebnerMatrix;
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_6,_8,_false>_>_>
  *in_stack_ffffffffffff6700;
  DenseCoeffsBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>,_1> *in_stack_ffffffffffff6708;
  value_type *in_stack_ffffffffffff6710;
  DenseBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> *in_stack_ffffffffffff6718;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_6,_8,_false>_>
  *in_stack_ffffffffffff6720;
  MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
  *in_stack_ffffffffffff6728;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
  *this;
  StorageBaseType *in_stack_ffffffffffff6748;
  double *in_stack_ffffffffffff6750;
  undefined8 in_stack_ffffffffffff6758;
  undefined1 computeEigenvectors;
  EigenBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> *in_stack_ffffffffffff6760;
  EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> *in_stack_ffffffffffff6768;
  cayley_t *in_stack_ffffffffffff6830;
  EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> *in_stack_ffffffffffff68a0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
  *local_94d0;
  double local_9430;
  double local_9428;
  double *local_9420;
  double local_9418;
  ulong local_9410;
  complex<double> local_93d8;
  int local_93c4;
  EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> local_8f40;
  EVP_PKEY_CTX local_8000 [26104];
  Matrix<double,_48,_85,_0,_48,_85> *in_stack_ffffffffffffe5f8;
  
  computeEigenvectors = (undefined1)((ulong)in_stack_ffffffffffff6758 >> 0x38);
  Eigen::DenseBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>::Zero();
  Eigen::Matrix<double,48,85,0,48,85>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,85,0,48,85>>>
            ((Matrix<double,_48,_85,_0,_48,_85> *)in_stack_ffffffffffff6708,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_48,_85,_0,_48,_85>_>_>
              *)in_stack_ffffffffffff6700);
  gp3p::init(local_8000);
  gp3p::compute(in_stack_ffffffffffffe5f8);
  Eigen::DenseBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>::Zero();
  Eigen::Matrix<double,8,8,0,8,8>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,8,8,0,8,8>>>
            ((Matrix<double,_8,_8,_0,_8,_8> *)in_stack_ffffffffffff6708,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_8,_8,_0,_8,_8>_>_>
              *)in_stack_ffffffffffff6700);
  Eigen::DenseBase<Eigen::Matrix<double,48,85,0,48,85>>::block<6,8>
            ((DenseBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_> *)in_stack_ffffffffffff6718,
             (Index)in_stack_ffffffffffff6710,(Index)in_stack_ffffffffffff6708);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_48,_85,_0,_48,_85>,_6,_8,_false>_>::operator-
            (in_stack_ffffffffffff6720);
  Eigen::DenseBase<Eigen::Matrix<double,8,8,0,8,8>>::block<6,8>
            (in_stack_ffffffffffff6718,(Index)in_stack_ffffffffffff6710,
             (Index)in_stack_ffffffffffff6708);
  Eigen::Block<Eigen::Matrix<double,8,8,0,8,8>,6,8,false>::operator=
            ((Block<Eigen::Matrix<double,_8,_8,_0,_8,_8>,_6,_8,_false> *)in_stack_ffffffffffff6708,
             in_stack_ffffffffffff6700);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>,_1>::operator()
                     (in_stack_ffffffffffff6708,(Index)in_stack_ffffffffffff6700,0x7fa770);
  *pSVar1 = 1.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>,_1>::operator()
                     (in_stack_ffffffffffff6708,(Index)in_stack_ffffffffffff6700,0x7fa793);
  *pSVar1 = 1.0;
  Eigen::EigenSolver<Eigen::Matrix<double,8,8,0,8,8>>::EigenSolver<Eigen::Matrix<double,8,8,0,8,8>>
            (in_stack_ffffffffffff6768,in_stack_ffffffffffff6760,(bool)computeEigenvectors);
  Eigen::EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>::eigenvalues(&local_8f40);
  Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>::Matrix
            ((Matrix<std::complex<double>,_8,_1,_0,_8,_1> *)in_stack_ffffffffffff6708,
             (Matrix<std::complex<double>,_8,_1,_0,_8,_1> *)in_stack_ffffffffffff6700);
  Eigen::EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>::eigenvectors(in_stack_ffffffffffff68a0)
  ;
  local_93c4 = 0;
  while( true ) {
    scalar = (long *)(long)local_93c4;
    IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>_> *)
                       0x7fa810);
    if (IVar2 <= (long)scalar) break;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>,_1>::
             operator[]((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>,_1> *)
                        in_stack_ffffffffffff6708,(Index)in_stack_ffffffffffff6700);
    local_93d8._M_value._0_8_ = *(undefined8 *)pSVar3->_M_value;
    local_93d8._M_value._8_8_ = *(undefined8 *)(pSVar3->_M_value + 8);
    dVar6 = std::complex<double>::imag_abi_cxx11_(&local_93d8);
    pdVar8 = (double *)0x3f1a36e2eb1c432d;
    if (dVar6 < 0.0001) {
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x7fa87d);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x7fa88a);
      for (local_9410 = 0; local_9410 < 3; local_9410 = local_9410 + 1) {
        Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>,_1>::operator()
                  ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>,_1> *)
                   in_stack_ffffffffffff6708,(Index)in_stack_ffffffffffff6700,0x7fa8c6);
        Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>,_1>::operator()
                  ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>,_1> *)
                   in_stack_ffffffffffff6708,(Index)in_stack_ffffffffffff6700,0x7fa8e5);
        std::operator/((complex<double> *)in_stack_ffffffffffff6700,(complex<double> *)0x7fa8f2);
        local_9420 = pdVar8;
        local_9418 = dVar6;
        dVar7 = std::complex<double>::real_abi_cxx11_((complex<double> *)&local_9420);
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                            in_stack_ffffffffffff6708,(Index)in_stack_ffffffffffff6700);
        *pSVar4 = dVar7;
        in_stack_ffffffffffff6748 =
             (StorageBaseType *)
             Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>,_1>::
             operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>,_1> *)
                        in_stack_ffffffffffff6708,(Index)in_stack_ffffffffffff6700,0x7fa95c);
        Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>,_1>::operator()
                  ((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>,_1> *)
                   in_stack_ffffffffffff6708,(Index)in_stack_ffffffffffff6700,0x7fa97b);
        std::operator/((complex<double> *)in_stack_ffffffffffff6700,(complex<double> *)0x7fa988);
        local_9430 = dVar7;
        local_9428 = dVar6;
        pdVar8 = (double *)std::complex<double>::real_abi_cxx11_((complex<double> *)&local_9430);
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                            in_stack_ffffffffffff6708,(Index)in_stack_ffffffffffff6700);
        *pSVar4 = (Scalar)pdVar8;
        in_stack_ffffffffffff6750 = pdVar8;
      }
      math::cayley2rot(in_stack_ffffffffffff6830);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transposeInPlace
                ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x7faa0c);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffff6708,
                 (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_ffffffffffff6700);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffff6708,
                 (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_ffffffffffff6700);
      local_94d0 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
                    *)0x0;
      while( true ) {
        this = local_94d0;
        pMVar5 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
                  *)Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols
                              ((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x7faa76);
        if (pMVar5 <= this) break;
        in_stack_ffffffffffff6728 =
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffff6708,(Index)in_stack_ffffffffffff6700);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffff6718,
                   (Index)in_stack_ffffffffffff6710);
        Eigen::operator*(in_stack_ffffffffffff6750,in_stack_ffffffffffff6748);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffff6718,
                   (Index)in_stack_ffffffffffff6710);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,3,1,true>const>>
        ::operator+(this,in_stack_ffffffffffff6728);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffff6720,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
                    *)in_stack_ffffffffffff6718);
        Eigen::Matrix<double,3,1,0,3,1>::
        Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,3,1,true>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,3,1,true>const>,0>>
                  ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffff6708,
                   (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_0>_>
                    *)in_stack_ffffffffffff6700);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
                  ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffff6728);
        Eigen::Matrix<double,3,1,0,3,1>::operator=
                  ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffff6708,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)in_stack_ffffffffffff6700);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffff6718,
                   (Index)in_stack_ffffffffffff6710);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
                  ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this,
                   in_stack_ffffffffffff6728);
        Eigen::Matrix<double,3,1,0,3,1>::operator=
                  ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffff6708,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>
                    *)in_stack_ffffffffffff6700);
        local_94d0 = local_94d0 + 1;
      }
      Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols
                ((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x7fabeb);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffff6760,
                 scalar);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffff6708,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  *)in_stack_ffffffffffff6700);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols
                ((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x7fac32);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffff6760,
                 scalar);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffff6708,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  *)in_stack_ffffffffffff6700);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffff6728);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffff6708,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_ffffffffffff6700);
      Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0x7facab);
      Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
                ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)in_stack_ffffffffffff6718,
                 (Index)in_stack_ffffffffffff6710,(Index)in_stack_ffffffffffff6708);
      Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>::operator=
                ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)
                 in_stack_ffffffffffff6708,
                 (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffff6700);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::col
                ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)in_stack_ffffffffffff6718,
                 (Index)in_stack_ffffffffffff6710);
      Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,true>::operator=
                ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> *)
                 in_stack_ffffffffffff6708,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffff6700);
      std::
      vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
      ::push_back((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                   *)in_stack_ffffffffffff6718,in_stack_ffffffffffff6710);
    }
    local_93c4 = local_93c4 + 1;
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gp3p_main(
    const Eigen::Matrix3d & f,
    const Eigen::Matrix3d & v,
    const Eigen::Matrix3d & p,
    transformations_t & solutions)
{
  Eigen::Matrix<double,48,85> groebnerMatrix =
      Eigen::Matrix<double,48,85>::Zero();
  gp3p::init(groebnerMatrix,f,v,p);
  gp3p::compute(groebnerMatrix);

  Eigen::Matrix<double,8,8> M = Eigen::Matrix<double,8,8>::Zero();
  M.block<6,8>(0,0) = -groebnerMatrix.block<6,8>(36,77);
  M(6,0) = 1.0;
  M(7,6) = 1.0;

  Eigen::EigenSolver< Eigen::Matrix<double,8,8> > Eig(M,true);
  Eigen::Matrix<std::complex<double>,8,1> D = Eig.eigenvalues();
  Eigen::Matrix<std::complex<double>,8,8> V = Eig.eigenvectors();

  for( int c = 0; c < V.cols(); c++ )
  {
    std::complex<double> eigValue = D[c];

    if( eigValue.imag() < 0.0001 )
    {
      cayley_t cayley;
      Eigen::Vector3d n;

      for(size_t i = 0; i < 3; i++)
      {
        std::complex<double> cay = V(i+4,c)/V(7,c);
        cayley[2-i] = cay.real();
        std::complex<double> depth = V(i+1,c)/V(7,c);
        n[2-i] = depth.real();
      }

      rotation_t rotation = math::cayley2rot(cayley);
      //the groebner problem was set up to find the transpose!
      rotation.transposeInPlace();

      point_t center_cam = Eigen::Vector3d::Zero();
      point_t center_world = Eigen::Vector3d::Zero();
      for( size_t i = 0; i < (size_t) f.cols(); i++ )
      {
        point_t temp = rotation*(n[i]*f.col(i)+v.col(i));
        center_cam = center_cam + temp;
        center_world = center_world + p.col(i);
      }

      center_cam = center_cam/f.cols();
      center_world = center_world/f.cols();
      translation_t translation = center_world - center_cam;

      transformation_t transformation;
      transformation.block<3,3>(0,0) = rotation;
      transformation.col(3) = translation;
      solutions.push_back(transformation);
    }
  }
}